

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O3

int __thiscall Console::init(Console *this,EVP_PKEY_CTX *ctx)

{
  EVP_PKEY_CTX *pEVar1;
  int iVar2;
  ROM *pRVar3;
  APU *this_00;
  PPU *this_01;
  CPU *this_02;
  Memory *this_03;
  Controller *this_04;
  EVP_PKEY_CTX *ctx_00;
  EVP_PKEY_CTX *local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  
  this->prev_frame = 0;
  pRVar3 = (ROM *)operator_new(0x2030);
  ROM::ROM(pRVar3);
  this->rom = pRVar3;
  this_00 = (APU *)operator_new(1);
  APU::APU(this_00);
  this->apu = this_00;
  this_01 = (PPU *)operator_new(0xac8);
  PPU::PPU(this_01,this_00);
  this->ppu = this_01;
  this_02 = (CPU *)operator_new(0x30);
  CPU::CPU(this_02);
  this->cpu = this_02;
  this_03 = (Memory *)operator_new(0x830);
  Memory::Memory(this_03);
  this->mem = this_03;
  this_04 = (Controller *)operator_new(10);
  Controller::Controller(this_04);
  this->controller = this_04;
  APU::init(this->apu,(EVP_PKEY_CTX *)this_00);
  pRVar3 = this->rom;
  pEVar1 = ctx + 0x10;
  if (*(EVP_PKEY_CTX **)ctx == pEVar1) {
    local_30 = *(undefined8 *)pEVar1;
    uStack_28 = *(undefined8 *)(ctx + 0x18);
    local_40 = (EVP_PKEY_CTX *)&local_30;
  }
  else {
    local_30 = *(undefined8 *)pEVar1;
    local_40 = *(EVP_PKEY_CTX **)ctx;
  }
  local_38 = *(undefined8 *)(ctx + 8);
  ctx_00 = (EVP_PKEY_CTX *)&local_40;
  *(EVP_PKEY_CTX **)ctx = pEVar1;
  *(undefined8 *)(ctx + 8) = 0;
  ctx[0x10] = (EVP_PKEY_CTX)0x0;
  ROM::init(pRVar3,ctx_00);
  if (local_40 != (EVP_PKEY_CTX *)&local_30) {
    operator_delete(local_40);
  }
  Memory::init(this->mem,ctx_00);
  CPU::init(this->cpu,ctx_00);
  iVar2 = PPU::init(this->ppu,ctx_00);
  return iVar2;
}

Assistant:

void Console::init(std::string filename) {
    prev_frame = 0;
    rom = new ROM();
    apu = new APU();
    ppu = new PPU(apu);
    cpu = new CPU();
    mem = new Memory();
    controller = new Controller();
    apu->init();
    rom->init(std::move(filename));
    mem->init();
    cpu->init();
    ppu->init();
}